

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_getmetatable(lua_State *L,int objindex)

{
  Table *pTVar1;
  StkId pTVar2;
  TValue *pTVar3;
  Table **ppTVar4;
  uint uVar5;
  
  pTVar3 = index2addr(L,objindex);
  uVar5 = pTVar3->tt_ & 0xf;
  if ((ulong)uVar5 == 7) {
    ppTVar4 = (Table **)((pTVar3->value_).f + 0x10);
  }
  else if (uVar5 == 5) {
    ppTVar4 = (Table **)((pTVar3->value_).f + 0x28);
  }
  else {
    ppTVar4 = L->l_G->mt + uVar5;
  }
  pTVar1 = *ppTVar4;
  if (pTVar1 != (Table *)0x0) {
    pTVar2 = L->top;
    (pTVar2->value_).gc = (GCObject *)pTVar1;
    pTVar2->tt_ = 0x45;
    L->top = L->top + 1;
  }
  return (uint)(pTVar1 != (Table *)0x0);
}

Assistant:

LUA_API int lua_getmetatable(lua_State *L, int objindex) {
    const TValue *obj;
    Table *mt;
    int res = 0;
    lua_lock(L);
    obj = index2addr(L, objindex);
    switch (ttnov(obj)) {
        case LUA_TTABLE:
            mt = hvalue(obj)->metatable;
            break;
        case LUA_TUSERDATA:
            mt = uvalue(obj)->metatable;
            break;
        default:
            mt = G(L)->mt[ttnov(obj)];
            break;
    }
    if (mt != NULL) {
        sethvalue(L, L->top, mt);
        api_incr_top(L);
        res = 1;
    }
    lua_unlock(L);
    return res;
}